

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_sx_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  undefined4 in_register_0000008c;
  longlong lVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i alVar9;
  __m128i alVar10;
  
  lVar4 = CONCAT44(in_register_0000008c,src1_stride);
  lVar2 = (ulong)src0_stride * 2;
  puVar5 = src0;
  puVar7 = src1;
  do {
    puVar6 = puVar5;
    puVar8 = puVar7;
    for (lVar3 = 0; lVar3 < w; lVar3 = lVar3 + 8) {
      auVar1 = *(undefined1 (*) [16])(mask + lVar3 * 2);
      pavgb(auVar1[1],auVar1[0]);
      pavgb(0,auVar1[1]);
      pavgb(auVar1[3],auVar1[2]);
      pavgb(0,auVar1[3]);
      pavgb(auVar1[5],auVar1[4]);
      pavgb(0,auVar1[5]);
      pavgb(auVar1[7],auVar1[6]);
      pavgb(0,auVar1[7]);
      pavgb(auVar1[9],auVar1[8]);
      pavgb(0,auVar1[9]);
      pavgb(auVar1[0xb],auVar1[10]);
      pavgb(0,auVar1[0xb]);
      pavgb(auVar1[0xd],auVar1[0xc]);
      pavgb(0,auVar1[0xd]);
      pavgb(auVar1[0xf],auVar1[0xe]);
      pavgb(0,auVar1[0xf]);
      pmovsxbw(auVar1,0x4040404040404040);
      alVar9[1] = lVar2;
      alVar9[0] = (longlong)src0;
      alVar10[1] = lVar4;
      alVar10[0] = (longlong)src1;
      alVar9 = (*blend)(puVar6,puVar8,alVar9,alVar10);
      src0 = alVar9[1];
      *(undefined8 *)(dst + lVar3) = extraout_XMM0_Qa;
      *(undefined8 *)(dst + lVar3 + 4) = extraout_XMM0_Qb;
      puVar8 = puVar8 + 8;
      puVar6 = puVar6 + 8;
    }
    mask = mask + mask_stride;
    dst = dst + dst_stride;
    puVar7 = puVar7 + src1_stride;
    puVar5 = puVar5 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sx_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_r_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_a_b = _mm_avg_epu8(v_r_b, _mm_srli_si128(v_r_b, 1));

      const __m128i v_m0_w = _mm_and_si128(v_a_b, v_zmask_b);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}